

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result * __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Invoke(Result *__return_storage_ptr__,
        FunctionMocker<ot::commissioner::Error_(std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *this,function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>
              *args,unsigned_long args_1,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<ot::commissioner::Error> *__p;
  pointer this_00;
  unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,_std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>_>_>
  local_68;
  unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,_std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>_>_>
  holder;
  ArgumentTuple tuple;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  unsigned_long args_local_1;
  function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>
  *args_local;
  FunctionMocker<ot::commissioner::Error_(std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_local;
  
  args_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1;
  args_local_1 = (unsigned_long)args;
  args_local = (function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>
                *)this;
  this_local = (FunctionMocker<ot::commissioner::Error_(std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)__return_storage_ptr__;
  std::
  tuple<std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::
  tuple<std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true,_true>
            ((tuple<std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&holder,args,(unsigned_long *)&args_local_2,args_2);
  f = UntypedFunctionMockerBase::UntypedInvokeWith
                (&this->super_UntypedFunctionMockerBase,
                 (tuple<std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&holder);
  __p = DownCast_<testing::internal::ActionResultHolder<ot::commissioner::Error>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>>>
  ::
  unique_ptr<std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>>>
              *)&local_68,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,_std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>_>_>
            ::operator->(&local_68);
  ActionResultHolder<ot::commissioner::Error>::Unwrap(__return_storage_ptr__,this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,_std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>_>_>
  ::~unique_ptr(&local_68);
  std::
  tuple<std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~tuple((tuple<std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            *)&holder);
  return __return_storage_ptr__;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }